

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

void setEntryName(UResourceDataEntry *res,char *name,UErrorCode *status)

{
  size_t sVar1;
  char *pcVar2;
  int32_t len;
  UErrorCode *status_local;
  char *name_local;
  UResourceDataEntry *res_local;
  
  sVar1 = strlen(name);
  if ((res->fName != (char *)0x0) && (res->fName != res->fNameBuffer)) {
    uprv_free_63(res->fName);
  }
  if ((int)sVar1 < 3) {
    res->fName = res->fNameBuffer;
  }
  else {
    pcVar2 = (char *)uprv_malloc_63((long)((int)sVar1 + 1));
    res->fName = pcVar2;
  }
  if (res->fName == (char *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    strcpy(res->fName,name);
  }
  return;
}

Assistant:

static void setEntryName(UResourceDataEntry *res, const char *name, UErrorCode *status) {
    int32_t len = (int32_t)uprv_strlen(name);
    if(res->fName != NULL && res->fName != res->fNameBuffer) {
        uprv_free(res->fName);
    }
    if (len < (int32_t)sizeof(res->fNameBuffer)) {
        res->fName = res->fNameBuffer;
    }
    else {
        res->fName = (char *)uprv_malloc(len+1);
    }
    if(res->fName == NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
    } else {
        uprv_strcpy(res->fName, name);
    }
}